

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall V2Transport::SetMessageToSend(V2Transport *this,CSerializedNetMsg *msg)

{
  byte bVar1;
  pointer puVar2;
  char *__first;
  Span<std::byte> output;
  bool bVar3;
  const_iterator cVar4;
  size_t sVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  Span<const_std::byte> contents_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock50;
  value_type_conflict local_59;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_40,&this->m_send_mutex,"m_send_mutex"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x5b0,false);
  if (this->m_send_state == READY) {
    if ((this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_58._M_impl.super__Vector_impl_data._M_start = (byte *)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(anonymous_namespace)::V2_MESSAGE_MAP,&msg->m_type);
      if (cVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_59 = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                   (size_type)
                   ((msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0xd - (long)(msg->data).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)),&local_59);
        __first = (msg->m_type)._M_dataplus._M_p;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,unsigned_char*>
                  (__first,__first + (msg->m_type)._M_string_length,
                   local_58._M_impl.super__Vector_impl_data._M_start + 1);
        pbVar6 = local_58._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar5 = (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        if (sVar5 != 0) {
          memmove(local_58._M_impl.super__Vector_impl_data._M_start + 0xd,puVar2,sVar5);
        }
      }
      else {
        bVar1 = *(byte *)((long)cVar4.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
                                ._M_cur + 0x28);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                   (size_type)
                   ((msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (1 - (long)(msg->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start)));
        *local_58._M_impl.super__Vector_impl_data._M_start = bVar1;
        puVar2 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar5 = (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        pbVar6 = local_58._M_impl.super__Vector_impl_data._M_start;
        if (sVar5 != 0) {
          memmove(local_58._M_impl.super__Vector_impl_data._M_start + 1,puVar2,sVar5);
          pbVar6 = local_58._M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_send_buffer,
                 (size_type)
                 (local_58._M_impl.super__Vector_impl_data._M_finish + (0x14 - (long)pbVar6)));
      contents_00.m_size =
           (long)local_58._M_impl.super__Vector_impl_data._M_finish -
           (long)local_58._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->m_send_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      output.m_size =
           (long)(this->m_send_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pbVar6;
      output.m_data = pbVar6;
      contents_00.m_data = local_58._M_impl.super__Vector_impl_data._M_start;
      BIP324Cipher::Encrypt
                (&this->m_cipher,contents_00,(Span<const_std::byte>)ZEXT816(0),false,output);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&this->m_send_type,&msg->m_type);
      ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&msg->data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
      bVar3 = true;
      goto LAB_0017937c;
    }
  }
  else if (this->m_send_state == V1) {
    bVar3 = V1Transport::SetMessageToSend(&this->m_v1_fallback,msg);
    goto LAB_0017937c;
  }
  bVar3 = false;
LAB_0017937c:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::SetMessageToSend(CSerializedNetMsg& msg) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.SetMessageToSend(msg);
    // We only allow adding a new message to be sent when in the READY state (so the packet cipher
    // is available) and the send buffer is empty. This limits the number of messages in the send
    // buffer to just one, and leaves the responsibility for queueing them up to the caller.
    if (!(m_send_state == SendState::READY && m_send_buffer.empty())) return false;
    // Construct contents (encoding message type + payload).
    std::vector<uint8_t> contents;
    auto short_message_id = V2_MESSAGE_MAP(msg.m_type);
    if (short_message_id) {
        contents.resize(1 + msg.data.size());
        contents[0] = *short_message_id;
        std::copy(msg.data.begin(), msg.data.end(), contents.begin() + 1);
    } else {
        // Initialize with zeroes, and then write the message type string starting at offset 1.
        // This means contents[0] and the unused positions in contents[1..13] remain 0x00.
        contents.resize(1 + CMessageHeader::COMMAND_SIZE + msg.data.size(), 0);
        std::copy(msg.m_type.begin(), msg.m_type.end(), contents.data() + 1);
        std::copy(msg.data.begin(), msg.data.end(), contents.begin() + 1 + CMessageHeader::COMMAND_SIZE);
    }
    // Construct ciphertext in send buffer.
    m_send_buffer.resize(contents.size() + BIP324Cipher::EXPANSION);
    m_cipher.Encrypt(MakeByteSpan(contents), {}, false, MakeWritableByteSpan(m_send_buffer));
    m_send_type = msg.m_type;
    // Release memory
    ClearShrink(msg.data);
    return true;
}